

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

bool wasm::isDebugEnabled(char *type)

{
  char *__s;
  bool bVar1;
  size_type sVar2;
  allocator<char> local_39;
  key_type local_38;
  char *local_18;
  char *type_local;
  
  if (debugEnabled) {
    local_18 = type;
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&debugTypesEnabled_abi_cxx11_);
    __s = local_18;
    if (bVar1) {
      type_local._7_1_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
      sVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&debugTypesEnabled_abi_cxx11_,&local_38);
      type_local._7_1_ = sVar2 != 0;
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  else {
    type_local._7_1_ = 0;
  }
  return (bool)(type_local._7_1_ & 1);
}

Assistant:

bool wasm::isDebugEnabled(const char* type) {
  if (!debugEnabled) {
    return false;
  }
  if (debugTypesEnabled.empty()) {
    return true;
  }
  return debugTypesEnabled.count(type) > 0;
}